

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

CType * cconv_childqual(CTState *cts,CType *ct,CTInfo *qual)

{
  CTInfo *qual_local;
  CType *ct_local;
  CTState *cts_local;
  
  ct_local = cts->tab + (ct->info & 0xffff);
  do {
    if (ct_local->info >> 0x1c == 8) {
      if ((ct_local->info >> 0x10 & 0xff) == 1) {
        *qual = ct_local->size | *qual;
      }
    }
    else if (ct_local->info >> 0x1c != 5) {
      *qual = ct_local->info & 0x3000000 | *qual;
      return ct_local;
    }
    ct_local = cts->tab + (ct_local->info & 0xffff);
  } while( true );
}

Assistant:

static CType *cconv_childqual(CTState *cts, CType *ct, CTInfo *qual)
{
  ct = ctype_child(cts, ct);
  for (;;) {
    if (ctype_isattrib(ct->info)) {
      if (ctype_attrib(ct->info) == CTA_QUAL) *qual |= ct->size;
    } else if (!ctype_isenum(ct->info)) {
      break;
    }
    ct = ctype_child(cts, ct);
  }
  *qual |= (ct->info & CTF_QUAL);
  return ct;
}